

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O3

void __thiscall
ExprWriterTest_ImplicationExprPrecedence_Test::TestBody
          (ExprWriterTest_ImplicationExprPrecedence_Test *this)

{
  vector<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  *this_00;
  ExprWriterTest_ImplicationExprPrecedence_Test *pEVar1;
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
  *pvVar2;
  bool bVar3;
  Impl *pIVar4;
  Impl *pIVar5;
  Impl *pIVar6;
  Impl *pIVar7;
  char *pcVar8;
  AssertionResult gtest_ar;
  AssertHelper local_a8;
  string local_a0;
  internal local_80 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *local_70;
  Impl *local_68;
  ExprWriterTest_ImplicationExprPrecedence_Test *local_60;
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
  *local_58;
  Impl *local_50;
  Impl *local_48;
  Impl *pIStack_40;
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory.exprs_;
  local_a0._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_a0);
  local_70 = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)operator_new__(0x80);
  *(Kind *)&(local_70->super_ExprBase).impl_ = FIRST_EXPR;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = (Impl *)local_70;
  local_70[1].super_ExprBase.impl_ = (Impl *)0x0;
  local_a0._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_a0);
  pIVar4 = (Impl *)operator_new__(0x80);
  pIVar4->kind_ = FIRST_EXPR;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar4;
  *(undefined8 *)(pIVar4 + 2) = 0x3ff0000000000000;
  pIVar7 = (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
           super_ExprBase.impl_;
  pIVar6 = (this->super_ExprWriterTest).l1.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
           super_ExprBase.impl_;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_a8);
  pIVar5 = (Impl *)operator_new__(0x100);
  pIVar5->kind_ = IMPLICATION;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar5;
  *(Impl **)&pIVar5[2].kind_ = pIVar7;
  *(Impl **)&pIVar5[4].kind_ = pIVar6;
  *(Impl **)&pIVar5[6].kind_ = pIVar7;
  pIVar7 = (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
           super_ExprBase.impl_;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_a8);
  pIVar6 = (Impl *)operator_new__(0x100);
  pIVar6->kind_ = IMPLICATION;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar6;
  *(Impl **)(pIVar6 + 2) = pIVar5;
  *(Impl **)&pIVar6[4].kind_ = pIVar7;
  *(Impl **)&pIVar6[6].kind_ = pIVar7;
  local_a8.data_ = (AssertHelperData *)0x0;
  local_58 = (vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_a8);
  local_50 = (Impl *)operator_new__(0x100);
  local_50->kind_ = IF;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = local_50;
  *(Impl **)(local_50 + 2) = pIVar6;
  *(Impl **)(local_50 + 4) = pIVar4;
  *(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> **)(local_50 + 6) = local_70;
  local_68 = pIVar4;
  local_60 = this;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_a0,(fmt *)0x1674c5,(CStringRef)&local_50,local_70);
  testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
            (local_80,"\"if 0 ==> 1 ==> 0 then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeImplication(MakeImplication(l0, l1, l0), l0, l0), n1, n0)))"
             ,(char (*) [24])"if 0 ==> 1 ==> 0 then 1",&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2e3,pcVar8);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_a0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pvVar2 = local_58;
  pEVar1 = local_60;
  pIVar7 = (local_60->super_ExprWriterTest).l0.
           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  pIVar6 = (local_60->super_ExprWriterTest).l1.
           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(local_58,(Impl **)&local_a8);
  pIVar4 = (Impl *)operator_new__(0x100);
  pIVar4->kind_ = IMPLICATION;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar4;
  *(Impl **)&pIVar4[2].kind_ = pIVar7;
  *(Impl **)&pIVar4[4].kind_ = pIVar6;
  *(Impl **)&pIVar4[6].kind_ = pIVar7;
  local_a8.data_ = (AssertHelperData *)0x0;
  local_48 = (pEVar1->super_ExprWriterTest).l0.
             super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  pIStack_40 = (pEVar1->super_ExprWriterTest).l1.
               super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(pvVar2,(Impl **)&local_a8);
  pIVar7 = (Impl *)operator_new__(0x100);
  pIVar7->kind_ = IMPLICATION;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar7;
  *(Impl **)(pIVar7 + 2) = pIVar4;
  *(Impl **)(pIVar7 + 4) = local_48;
  *(Impl **)(pIVar7 + 6) = pIStack_40;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(pvVar2,(Impl **)&local_a8);
  local_50 = (Impl *)operator_new__(0x100);
  local_50->kind_ = IF;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = local_50;
  *(Impl **)(local_50 + 2) = pIVar7;
  *(Impl **)(local_50 + 4) = local_68;
  *(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> **)(local_50 + 6) = local_70;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_a0,(fmt *)0x1674c5,(CStringRef)&local_50,local_70);
  testing::internal::CmpHelperEQ<char[31],std::__cxx11::string>
            (local_80,"\"if 0 ==> 1 ==> 0 else 1 then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeImplication(MakeImplication(l0, l1, l0), l0, l1), n1, n0)))"
             ,(char (*) [31])"if 0 ==> 1 ==> 0 else 1 then 1",&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2e5,pcVar8);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_a0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pvVar2 = local_58;
  pEVar1 = local_60;
  pIVar7 = (local_60->super_ExprWriterTest).l0.
           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  pIVar6 = (local_60->super_ExprWriterTest).l1.
           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(local_58,(Impl **)&local_a8);
  pIVar4 = (Impl *)operator_new__(0x100);
  pIVar4->kind_ = IMPLICATION;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar4;
  *(Impl **)&pIVar4[2].kind_ = pIVar7;
  *(Impl **)&pIVar4[4].kind_ = pIVar6;
  *(Impl **)&pIVar4[6].kind_ = pIVar7;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(pvVar2,(Impl **)&local_a8);
  pIVar5 = (Impl *)operator_new__(0x100);
  pIVar5->kind_ = IMPLICATION;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar5;
  *(Impl **)&pIVar5[2].kind_ = pIVar7;
  *(Impl **)&pIVar5[4].kind_ = pIVar6;
  *(Impl **)(pIVar5 + 6) = pIVar4;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(pvVar2,(Impl **)&local_a8);
  local_50 = (Impl *)operator_new__(0x100);
  local_50->kind_ = IF;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = local_50;
  *(Impl **)(local_50 + 2) = pIVar5;
  *(Impl **)(local_50 + 4) = local_68;
  *(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> **)(local_50 + 6) = local_70;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_a0,(fmt *)0x1674c5,(CStringRef)&local_50,local_70);
  testing::internal::CmpHelperEQ<char[31],std::__cxx11::string>
            (local_80,"\"if 0 ==> 1 else 0 ==> 1 then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeImplication(l0, l1, MakeImplication(l0, l1, l0)), n1, n0)))"
             ,(char (*) [31])"if 0 ==> 1 else 0 ==> 1 then 1",&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2e7,pcVar8);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_a0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pvVar2 = local_58;
  pEVar1 = local_60;
  pIVar7 = (local_60->super_ExprWriterTest).l0.
           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  pIVar6 = (local_60->super_ExprWriterTest).l1.
           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(local_58,(Impl **)&local_a8);
  pIVar4 = (Impl *)operator_new__(0x100);
  pIVar4->kind_ = IMPLICATION;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar4;
  *(Impl **)&pIVar4[2].kind_ = pIVar6;
  *(Impl **)&pIVar4[4].kind_ = pIVar7;
  *(Impl **)&pIVar4[6].kind_ = pIVar7;
  pIVar6 = (pEVar1->super_ExprWriterTest).l1.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>
           .super_ExprBase.impl_;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(pvVar2,(Impl **)&local_a8);
  pIVar5 = (Impl *)operator_new__(0x100);
  pIVar5->kind_ = IMPLICATION;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar5;
  *(Impl **)&pIVar5[2].kind_ = pIVar7;
  *(Impl **)(pIVar5 + 4) = pIVar4;
  *(Impl **)&pIVar5[6].kind_ = pIVar6;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(pvVar2,(Impl **)&local_a8);
  local_50 = (Impl *)operator_new__(0x100);
  local_50->kind_ = IF;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = local_50;
  *(Impl **)(local_50 + 2) = pIVar5;
  *(Impl **)(local_50 + 4) = local_68;
  *(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> **)(local_50 + 6) = local_70;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_a0,(fmt *)0x1674c5,(CStringRef)&local_50,local_70);
  testing::internal::CmpHelperEQ<char[33],std::__cxx11::string>
            (local_80,"\"if 0 ==> (1 ==> 0) else 1 then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeImplication(l0, MakeImplication(l1, l0, l0), l1), n1, n0)))"
             ,(char (*) [33])"if 0 ==> (1 ==> 0) else 1 then 1",&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2e9,pcVar8);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_a0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pvVar2 = local_58;
  pEVar1 = local_60;
  pIVar7 = (local_60->super_ExprWriterTest).l0.
           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  pIVar6 = (local_60->super_ExprWriterTest).l1.
           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(local_58,(Impl **)&local_a8);
  pIVar4 = (Impl *)operator_new__(0x100);
  pIVar4->kind_ = IMPLICATION;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar4;
  *(Impl **)&pIVar4[2].kind_ = pIVar6;
  *(Impl **)&pIVar4[4].kind_ = pIVar7;
  *(Impl **)&pIVar4[6].kind_ = pIVar6;
  pIVar6 = (pEVar1->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>
           .super_ExprBase.impl_;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(pvVar2,(Impl **)&local_a8);
  pIVar5 = (Impl *)operator_new__(0x100);
  pIVar5->kind_ = IMPLICATION;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar5;
  *(Impl **)&pIVar5[2].kind_ = pIVar7;
  *(Impl **)(pIVar5 + 4) = pIVar4;
  *(Impl **)&pIVar5[6].kind_ = pIVar6;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(pvVar2,(Impl **)&local_a8);
  local_50 = (Impl *)operator_new__(0x100);
  local_50->kind_ = IF;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = local_50;
  *(Impl **)(local_50 + 2) = pIVar5;
  *(Impl **)(local_50 + 4) = local_68;
  *(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> **)(local_50 + 6) = local_70;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_a0,(fmt *)0x1674c5,(CStringRef)&local_50,local_70);
  testing::internal::CmpHelperEQ<char[33],std::__cxx11::string>
            (local_80,"\"if 0 ==> (1 ==> 0 else 1) then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeImplication(l0, MakeImplication(l1, l0, l1), l0), n1, n0)))"
             ,(char (*) [33])"if 0 ==> (1 ==> 0 else 1) then 1",&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2eb,pcVar8);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_a0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pvVar2 = local_58;
  pEVar1 = local_60;
  pIVar7 = (local_60->super_ExprWriterTest).l0.
           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  pIVar6 = (local_60->super_ExprWriterTest).l1.
           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(local_58,(Impl **)&local_a8);
  pIVar4 = (Impl *)operator_new__(0xc0);
  pIVar4->kind_ = FIRST_BINARY_LOGICAL;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar4;
  *(Impl **)&pIVar4[2].kind_ = pIVar6;
  *(Impl **)&pIVar4[4].kind_ = pIVar7;
  local_48 = (pEVar1->super_ExprWriterTest).l1.
             super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(pvVar2,(Impl **)&local_a8);
  pIVar6 = (Impl *)operator_new__(0x100);
  pIVar6->kind_ = IMPLICATION;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar6;
  *(Impl **)&pIVar6[2].kind_ = pIVar7;
  *(Impl **)(pIVar6 + 4) = pIVar4;
  *(Impl **)(pIVar6 + 6) = local_48;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(pvVar2,(Impl **)&local_a8);
  local_50 = (Impl *)operator_new__(0x100);
  local_50->kind_ = IF;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = local_50;
  *(Impl **)(local_50 + 2) = pIVar6;
  *(Impl **)(local_50 + 4) = local_68;
  *(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> **)(local_50 + 6) = local_70;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_a0,(fmt *)0x1674c5,(CStringRef)&local_50,local_70);
  testing::internal::CmpHelperEQ<char[30],std::__cxx11::string>
            (local_80,"\"if 0 ==> 1 || 0 else 1 then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeImplication( l0, MakeBinaryLogical(ex::OR, l1, l0), l1), n1, n0)))"
             ,(char (*) [30])"if 0 ==> 1 || 0 else 1 then 1",&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2ee,pcVar8);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_a0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pvVar2 = local_58;
  pEVar1 = local_60;
  pIVar7 = (local_60->super_ExprWriterTest).l0.
           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  pIVar6 = (local_60->super_ExprWriterTest).l1.
           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(local_58,(Impl **)&local_a8);
  pIVar4 = (Impl *)operator_new__(0xc0);
  pIVar4->kind_ = IFF;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar4;
  *(Impl **)&pIVar4[2].kind_ = pIVar6;
  *(Impl **)&pIVar4[4].kind_ = pIVar7;
  local_48 = (pEVar1->super_ExprWriterTest).l1.
             super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(pvVar2,(Impl **)&local_a8);
  pIVar6 = (Impl *)operator_new__(0x100);
  pIVar6->kind_ = IMPLICATION;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar6;
  *(Impl **)&pIVar6[2].kind_ = pIVar7;
  *(Impl **)(pIVar6 + 4) = pIVar4;
  *(Impl **)(pIVar6 + 6) = local_48;
  local_a8.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(pvVar2,(Impl **)&local_a8);
  local_50 = (Impl *)operator_new__(0x100);
  local_50->kind_ = IF;
  (pEVar1->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = local_50;
  *(Impl **)(local_50 + 2) = pIVar6;
  *(Impl **)(local_50 + 4) = local_68;
  *(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> **)(local_50 + 6) = local_70;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_a0,(fmt *)0x1674c5,(CStringRef)&local_50,local_70);
  testing::internal::CmpHelperEQ<char[34],std::__cxx11::string>
            (local_80,"\"if 0 ==> (1 <==> 0) else 1 then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeImplication( l0, MakeBinaryLogical(ex::IFF, l1, l0), l1), n1, n0)))"
             ,(char (*) [34])"if 0 ==> (1 <==> 0) else 1 then 1",&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2f1,pcVar8);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_a0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprWriterTest, ImplicationExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  CHECK_WRITE("if 0 ==> 1 ==> 0 then 1",
      MakeIf(MakeImplication(MakeImplication(l0, l1, l0), l0, l0), n1, n0));
  CHECK_WRITE("if 0 ==> 1 ==> 0 else 1 then 1",
      MakeIf(MakeImplication(MakeImplication(l0, l1, l0), l0, l1), n1, n0));
  CHECK_WRITE("if 0 ==> 1 else 0 ==> 1 then 1",
      MakeIf(MakeImplication(l0, l1, MakeImplication(l0, l1, l0)), n1, n0));
  CHECK_WRITE("if 0 ==> (1 ==> 0) else 1 then 1",
      MakeIf(MakeImplication(l0, MakeImplication(l1, l0, l0), l1), n1, n0));
  CHECK_WRITE("if 0 ==> (1 ==> 0 else 1) then 1",
      MakeIf(MakeImplication(l0, MakeImplication(l1, l0, l1), l0), n1, n0));
  CHECK_WRITE("if 0 ==> 1 || 0 else 1 then 1",
              MakeIf(MakeImplication(
                       l0, MakeBinaryLogical(ex::OR, l1, l0), l1), n1, n0));
  CHECK_WRITE("if 0 ==> (1 <==> 0) else 1 then 1",
              MakeIf(MakeImplication(
                       l0, MakeBinaryLogical(ex::IFF, l1, l0), l1), n1, n0));
}